

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O0

void __thiscall
NfcFilter::process2(NfcFilter *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  anon_class_40_7_b1743439 __unary_op;
  const_iterator pfVar1;
  const_iterator pfVar2;
  undefined8 in_RCX;
  long in_RDI;
  anon_class_40_7_b1743439 proc_sample;
  float z2;
  float z1;
  float a2;
  float a1;
  float b2;
  float b1;
  float gain;
  float *in_stack_ffffffffffffff70;
  float *pfStack_88;
  float *local_80;
  float *pfStack_78;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  span<const_float,_18446744073709551615UL> local_10;
  
  local_68 = *(undefined4 *)(in_RDI + 0x18);
  local_64 = *(undefined4 *)(in_RDI + 0x1c);
  local_60 = *(undefined4 *)(in_RDI + 0x20);
  local_5c = *(undefined4 *)(in_RDI + 0x24);
  local_58 = *(undefined4 *)(in_RDI + 0x28);
  local_38 = *(undefined4 *)(in_RDI + 0x2c);
  local_3c = *(undefined4 *)(in_RDI + 0x30);
  local_50 = &local_38;
  local_48 = &local_3c;
  local_34 = local_58;
  local_30 = local_5c;
  local_2c = local_60;
  local_28 = local_64;
  local_24 = local_68;
  local_20 = in_RCX;
  pfVar1 = al::span<const_float,_18446744073709551615UL>::cbegin(&local_10);
  pfVar2 = al::span<const_float,_18446744073709551615UL>::cend(&local_10);
  memcpy(&stack0xffffffffffffff70,&local_68,0x28);
  __unary_op._8_8_ = pfVar2;
  __unary_op._0_8_ = pfVar1;
  __unary_op._16_8_ = local_20;
  __unary_op.z1 = (float *)in_RDI;
  __unary_op.z2 = in_stack_ffffffffffffff70;
  std::
  transform<float_const*,float*,NfcFilter::process2(al::span<float_const,18446744073709551615ul>,float*)::__0>
            (pfStack_78,local_80,pfStack_88,__unary_op);
  *(undefined4 *)(in_RDI + 0x2c) = local_38;
  *(undefined4 *)(in_RDI + 0x30) = local_3c;
  return;
}

Assistant:

void NfcFilter::process2(const al::span<const float> src, float *RESTRICT dst)
{
    const float gain{second.gain};
    const float b1{second.b1};
    const float b2{second.b2};
    const float a1{second.a1};
    const float a2{second.a2};
    float z1{second.z[0]};
    float z2{second.z[1]};
    auto proc_sample = [gain,b1,b2,a1,a2,&z1,&z2](const float in) noexcept -> float
    {
        const float y{in*gain - a1*z1 - a2*z2};
        const float out{y + b1*z1 + b2*z2};
        z2 += z1;
        z1 += y;
        return out;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);
    second.z[0] = z1;
    second.z[1] = z2;
}